

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_next_url(char **globbed,URLGlob *glob)

{
  size_t sVar1;
  unsigned_long uVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_long *puVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  
  sVar1 = glob->urllen;
  pcVar4 = glob->glob_buffer;
  *globbed = (char *)0x0;
  if (glob->beenhere == '\0') {
    glob->beenhere = '\x01';
    bVar13 = glob->size == 0;
LAB_0011c441:
    if (!bVar13) {
      lVar11 = sVar1 + 1;
      puVar7 = &glob->pattern[0].content.NumRange.ptr_n;
      uVar10 = 0;
      do {
        iVar9 = *(int *)(puVar7 + -4);
        if (iVar9 == 3) {
          curl_msnprintf(pcVar4,lVar11,"%0*lu",*(int *)(puVar7 + -1),*puVar7);
LAB_0011c4ed:
          sVar5 = strlen(pcVar4);
          pcVar4 = pcVar4 + sVar5;
          lVar11 = lVar11 - sVar5;
        }
        else if (iVar9 == 2) {
          if (lVar11 == 0) {
            lVar11 = 0;
          }
          else {
            *pcVar4 = *(char *)((long)puVar7 + -0x16);
            pcVar4[1] = '\0';
            pcVar4 = pcVar4 + 1;
            lVar11 = lVar11 + -1;
          }
        }
        else {
          if (iVar9 != 1) {
LAB_0011c519:
            curl_mprintf("internal error: invalid pattern type (%d)\n");
            return CURLE_FAILED_INIT;
          }
          if (((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar7 + -3))->min_n != 0) {
            curl_msnprintf(pcVar4,lVar11,"%s");
            goto LAB_0011c4ed;
          }
        }
        uVar10 = uVar10 + 1;
        puVar7 = puVar7 + 6;
      } while (uVar10 < glob->size);
    }
    pcVar4 = strdup(glob->glob_buffer);
    *globbed = pcVar4;
    CVar3 = CURLE_OUT_OF_MEMORY;
    if (pcVar4 != (char *)0x0) {
      CVar3 = CURLE_OK;
    }
  }
  else {
    sVar6 = glob->size;
    CVar3 = CURLE_OK;
    if (sVar6 != 0) {
      puVar7 = &glob->pattern[sVar6 - 1].content.NumRange.step;
      do {
        iVar9 = (int)puVar7[-5];
        if (iVar9 == 3) {
          uVar2 = puVar7[-1];
          puVar7[-1] = uVar2 + *puVar7;
          if (uVar2 + *puVar7 <= puVar7[-3]) {
LAB_0011c43f:
            bVar13 = false;
            goto LAB_0011c441;
          }
          puVar7[-1] = ((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar7 + -4))->min_n;
        }
        else if (iVar9 == 2) {
          cVar8 = *(char *)((long)puVar7 + -0x1e) + *(char *)((long)puVar7 + -0x1c);
          *(char *)((long)puVar7 + -0x1e) = cVar8;
          if (cVar8 <= *(char *)((long)puVar7 + -0x1f)) goto LAB_0011c43f;
          *(char *)((long)puVar7 + -0x1e) =
               (char)((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar7 + -4))->min_n;
        }
        else {
          if (iVar9 != 1) goto LAB_0011c519;
          bVar13 = false;
          if (((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar7 + -4))->min_n == 0)
          goto LAB_0011c441;
          iVar9 = *(int *)((long)puVar7 + -0x14) + 1;
          bVar12 = iVar9 == (int)puVar7[-3];
          if (bVar12) {
            iVar9 = 0;
          }
          *(int *)((long)puVar7 + -0x14) = iVar9;
          if (!bVar12) goto LAB_0011c441;
        }
        puVar7 = puVar7 + -6;
        sVar6 = sVar6 - 1;
        CVar3 = CURLE_OK;
      } while (sVar6 != 0);
    }
  }
  return CVar3;
}

Assistant:

CURLcode glob_next_url(char **globbed, URLGlob *glob)
{
  URLPattern *pat;
  size_t i;
  size_t len;
  size_t buflen = glob->urllen + 1;
  char *buf = glob->glob_buffer;

  *globbed = NULL;

  if(!glob->beenhere)
    glob->beenhere = 1;
  else {
    bool carry = TRUE;

    /* implement a counter over the index ranges of all patterns, starting
       with the rightmost pattern */
    for(i = 0; carry && (i < glob->size); i++) {
      carry = FALSE;
      pat = &glob->pattern[glob->size - 1 - i];
      switch(pat->type) {
      case UPTSet:
        if((pat->content.Set.elements) &&
           (++pat->content.Set.ptr_s == pat->content.Set.size)) {
          pat->content.Set.ptr_s = 0;
          carry = TRUE;
        }
        break;
      case UPTCharRange:
        pat->content.CharRange.ptr_c =
          (char)(pat->content.CharRange.step +
                 (int)((unsigned char)pat->content.CharRange.ptr_c));
        if(pat->content.CharRange.ptr_c > pat->content.CharRange.max_c) {
          pat->content.CharRange.ptr_c = pat->content.CharRange.min_c;
          carry = TRUE;
        }
        break;
      case UPTNumRange:
        pat->content.NumRange.ptr_n += pat->content.NumRange.step;
        if(pat->content.NumRange.ptr_n > pat->content.NumRange.max_n) {
          pat->content.NumRange.ptr_n = pat->content.NumRange.min_n;
          carry = TRUE;
        }
        break;
      default:
        printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
        return CURLE_FAILED_INIT;
      }
    }
    if(carry) {         /* first pattern ptr has run into overflow, done! */
      return CURLE_OK;
    }
  }

  for(i = 0; i < glob->size; ++i) {
    pat = &glob->pattern[i];
    switch(pat->type) {
    case UPTSet:
      if(pat->content.Set.elements) {
        msnprintf(buf, buflen, "%s",
                  pat->content.Set.elements[pat->content.Set.ptr_s]);
        len = strlen(buf);
        buf += len;
        buflen -= len;
      }
      break;
    case UPTCharRange:
      if(buflen) {
        *buf++ = pat->content.CharRange.ptr_c;
        *buf = '\0';
        buflen--;
      }
      break;
    case UPTNumRange:
      msnprintf(buf, buflen, "%0*lu",
                pat->content.NumRange.padlength,
                pat->content.NumRange.ptr_n);
      len = strlen(buf);
      buf += len;
      buflen -= len;
      break;
    default:
      printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
      return CURLE_FAILED_INIT;
    }
  }

  *globbed = strdup(glob->glob_buffer);
  if(!*globbed)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}